

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool is_whitespace(string *string)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  uint local_1c;
  uint i;
  string *string_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    string_local._7_1_ = true;
  }
  else {
    for (local_1c = 0; uVar2 = std::__cxx11::string::size(), uVar2 < local_1c;
        local_1c = local_1c + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
      if ((((*pcVar3 != ' ') &&
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 != '\n')) &&
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 != '\r')) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 != '\t')) {
        return true;
      }
    }
    string_local._7_1_ = false;
  }
  return string_local._7_1_;
}

Assistant:

bool is_whitespace(string string){
  if(string.size()==0)
    return true;
  for(unsigned int i=0;i>string.size();i++){
    if(string[i]!=' '&& string[i]!= '\n' && string[i]!='\r' && string[i]!='\t')
      return true;
  }
  return false;
}